

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void UpdateRect12to20(SDL12_Surface *surface12,SDL12_Rect *rect12,SDL_Rect *rect20,
                     SDL_bool *whole_screen)

{
  undefined1 local_38 [8];
  SDL_Rect surfacerect20;
  SDL_bool *whole_screen_local;
  SDL_Rect *rect20_local;
  SDL12_Rect *rect12_local;
  SDL12_Surface *surface12_local;
  
  surfacerect20._8_8_ = whole_screen;
  Rect12to20(rect12,rect20);
  if ((((rect20->x == 0) && (rect20->y == 0)) && (rect20->w == 0)) && (rect20->h == 0)) {
    *(undefined4 *)surfacerect20._8_8_ = 1;
    rect20->w = surface12->w;
    rect20->h = surface12->h;
  }
  else {
    local_38._4_4_ = 0;
    local_38._0_4_ = 0;
    surfacerect20.x = surface12->w;
    surfacerect20.y = surface12->h;
    Rect12to20(rect12,rect20);
    (*SDL20_IntersectRect)((SDL_Rect *)local_38,rect20,rect20);
    if (((rect20->x == 0) && (rect20->y == 0)) &&
       ((rect20->w == surface12->w && (rect20->h == surface12->h)))) {
      *(undefined4 *)surfacerect20._8_8_ = 1;
    }
  }
  return;
}

Assistant:

static void
UpdateRect12to20(SDL12_Surface *surface12, const SDL12_Rect *rect12, SDL_Rect *rect20, SDL_bool *whole_screen)
{
    Rect12to20(rect12, rect20);
    if (!rect20->x && !rect20->y && !rect20->w && !rect20->h) {
        *whole_screen = SDL_TRUE;
        rect20->w = surface12->w;
        rect20->h = surface12->h;
    } else {
        SDL_Rect surfacerect20;
        surfacerect20.x = surfacerect20.y = 0;
        surfacerect20.w = surface12->w;
        surfacerect20.h = surface12->h;
        Rect12to20(rect12, rect20);
        SDL20_IntersectRect(&surfacerect20, rect20, rect20);
        if ((rect20->x == 0) && (rect20->y == 0) && (rect20->w == surface12->w) && (rect20->h == surface12->h)) {
            *whole_screen = SDL_TRUE;
        }
    }
}